

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O1

MCRegister __thiscall
llvm::MCRegisterInfo::getMatchingSuperReg
          (MCRegisterInfo *this,MCRegister Reg,uint SubIdx,MCRegisterClass *RC)

{
  short sVar1;
  MCRegister MVar2;
  undefined1 local_40 [8];
  MCSuperRegIterator Supers;
  
  MCSuperRegIterator::MCSuperRegIterator((MCSuperRegIterator *)local_40,Reg,this,false);
  while( true ) {
    if (Supers.super_DiffListIterator._0_8_ == 0) {
      return (MCRegister)0;
    }
    MVar2.Reg._2_2_ = 0;
    MVar2.Reg._0_2_ = local_40._0_2_;
    if ((((uint)((ushort)local_40._0_2_ >> 3) < (uint)RC->RegSetSize) &&
        ((RC->RegSet[(uint)((ushort)local_40._0_2_ >> 3)] >> ((ushort)local_40._0_2_ & 7) & 1) != 0)
        ) && (MVar2 = getSubReg(this,MVar2,SubIdx), MVar2.Reg == Reg.Reg)) break;
    if (Supers.super_DiffListIterator._0_8_ == 0) {
      __assert_fail("isValid() && \"Cannot move off the end of the list.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/MC/MCRegisterInfo.h"
                    ,0xcc,"MCRegister llvm::MCRegisterInfo::DiffListIterator::advance()");
    }
    sVar1 = *(short *)Supers.super_DiffListIterator._0_8_;
    local_40._0_2_ = local_40._0_2_ + sVar1;
    Supers.super_DiffListIterator._0_8_ = Supers.super_DiffListIterator._0_8_ + 2;
    if (sVar1 == 0) {
      Supers.super_DiffListIterator.Val = 0;
      Supers.super_DiffListIterator._2_6_ = 0;
    }
  }
  return (MCRegister)(uint)(ushort)local_40._0_2_;
}

Assistant:

MCRegister
MCRegisterInfo::getMatchingSuperReg(MCRegister Reg, unsigned SubIdx,
                                    const MCRegisterClass *RC) const {
  for (MCSuperRegIterator Supers(Reg, this); Supers.isValid(); ++Supers)
    if (RC->contains(*Supers) && Reg == getSubReg(*Supers, SubIdx))
      return *Supers;
  return 0;
}